

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

status_t tchecker::refdbm::bound_spread(db_t *rdbm,reference_clock_variables_t *r,integer_t spread)

{
  clock_id_t cVar1;
  status_t sVar2;
  allocator<unsigned_long> local_41;
  undefined1 local_40 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> ref_clocks;
  integer_t spread_local;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  
  ref_clocks.m_num_bits._4_4_ = spread;
  cVar1 = reference_clock_variables_t::refcount(r);
  std::allocator<unsigned_long>::allocator(&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,(ulong)cVar1,
             0,&local_41);
  std::allocator<unsigned_long>::~allocator(&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  sVar2 = bound_spread(rdbm,r,ref_clocks.m_num_bits._4_4_,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return sVar2;
}

Assistant:

enum tchecker::dbm::status_t bound_spread(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                          tchecker::integer_t spread)
{
  boost::dynamic_bitset<> ref_clocks{r.refcount()};
  ref_clocks.set();
  return tchecker::refdbm::bound_spread(rdbm, r, spread, ref_clocks);
}